

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

void __thiscall YAJLTables::fetch_qtable(YAJLTables *this,bitio_stream *bstream)

{
  ssize_t sVar1;
  YAJLQTable *pYVar2;
  byte bVar3;
  size_t in_RCX;
  void *in_RDX;
  undefined1 auStack_30 [7];
  u8 qk_size;
  YAJLQTable table;
  u32 seg_len;
  bitio_stream *bstream_local;
  YAJLTables *this_local;
  
  sVar1 = bitio::bitio_stream::read(bstream,0x10,in_RDX,in_RCX);
  for (table._12_4_ = (int)sVar1 + -2; table._12_4_ != 0;
      table._12_4_ = table._12_4_ - ((uint)bVar3 * 8 + 1)) {
    YAJLQTable::YAJLQTable((YAJLQTable *)auStack_30,bstream);
    bVar3 = 0x10;
    if ((char)table.coeffs == '\0') {
      bVar3 = 8;
    }
    pYVar2 = this->qtables + table.coeffs._1_1_;
    pYVar2->coeffs = _auStack_30;
    pYVar2->precision = (char)table.coeffs;
    pYVar2->dest_id = table.coeffs._1_1_;
  }
  return;
}

Assistant:

void YAJLTables::fetch_qtable(bitio::bitio_stream *bstream) {
    u32 seg_len = bstream->read(0x10);
    // exclude size of Lq which is 2 bytes
    seg_len -= 2;
    while (seg_len > 0) {
        YAJLQTable table(bstream);
        u8 qk_size = table.precision == 0 ? 8 : 16;
        qtables[table.dest_id] = table;
        seg_len -= 1 + (qk_size << 3);
    }
}